

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_finalizeDictionary
                 (void *dictBuffer,size_t dictBufferCapacity,void *customDictContent,
                 size_t dictContentSize,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                 ZDICT_params_t params)

{
  size_t __n;
  void *__dest;
  xxh_u64 xVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n_00;
  int compressionLevel;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n_01;
  size_t sVar11;
  BYTE header [256];
  
  compressionLevel = 3;
  if (params.compressionLevel != 0) {
    compressionLevel = params.compressionLevel;
  }
  uVar2 = CONCAT71((int7)(dictContentSize >> 8),
                   dictBufferCapacity < 0x100 || dictBufferCapacity < dictContentSize);
  sVar11 = 0xffffffffffffffba;
  if (dictBufferCapacity >= 0x100 && dictBufferCapacity >= dictContentSize) {
    header[0] = '7';
    header[1] = 0xa4;
    header[2] = '0';
    header[3] = 0xec;
    plVar5 = (long *)customDictContent;
    if (dictContentSize < 0x20) {
      lVar4 = 0x27d4eb2f165667c5;
    }
    else {
      uVar9 = 0x61c8864e7a143579;
      lVar4 = 0x60ea27eeadc0b5d6;
      uVar2 = 0;
      uVar10 = 0xc2b2ae3d27d4eb4f;
      do {
        uVar7 = *plVar5 * -0x3d4d51c2d82b14b1 + lVar4;
        uVar8 = uVar7 * 0x80000000 | uVar7 >> 0x21;
        lVar4 = uVar8 * -0x61c8864e7a143579;
        uVar10 = plVar5[1] * -0x3d4d51c2d82b14b1 + uVar10;
        uVar3 = uVar10 * 0x80000000 | uVar10 >> 0x21;
        uVar2 = plVar5[2] * -0x3d4d51c2d82b14b1 + uVar2;
        uVar7 = uVar2 * 0x80000000 | uVar2 >> 0x21;
        uVar10 = uVar3 * -0x61c8864e7a143579;
        uVar2 = uVar7 * -0x61c8864e7a143579;
        uVar9 = plVar5[3] * -0x3d4d51c2d82b14b1 + uVar9;
        uVar6 = uVar9 * 0x80000000 | uVar9 >> 0x21;
        uVar9 = uVar6 * -0x61c8864e7a143579;
        plVar5 = plVar5 + 4;
      } while (plVar5 < (long *)((long)customDictContent + (dictContentSize - 0x1f)));
      uVar2 = ((uVar7 * -0x784349ab80000000 | uVar7 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              ((uVar3 * -0x784349ab80000000 | uVar3 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              ((uVar8 * -0x784349ab80000000 | uVar8 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              (uVar6 * -0x1939e850d5e40000 | uVar9 >> 0x2e) +
              (uVar7 * 0x779b185ebca87000 | uVar2 >> 0x34) +
              (uVar3 * 0x1bbcd8c2f5e54380 | uVar10 >> 0x39) +
              (uVar8 * 0x3c6ef3630bd7950e | (ulong)(lVar4 < 0))) * -0x61c8864e7a143579 +
              0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579
              + 0x85ebca77c2b2ae63;
      lVar4 = ((uVar6 * -0x784349ab80000000 | uVar6 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^ uVar2) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
    }
    xVar1 = XXH64_finalize(lVar4 + dictContentSize,(xxh_u8 *)plVar5,dictContentSize,
                           (XXH_alignment)uVar2);
    header._4_4_ = (int)xVar1 + (int)(xVar1 / 0x7fff8000) * -0x7fff8000 + 0x8000;
    if (params.dictID != 0) {
      header._4_4_ = params.dictID;
    }
    if (1 < params.notificationLevel) {
      ZDICT_finalizeDictionary_cold_1();
    }
    sVar11 = ZDICT_analyzeEntropy
                       (header + 8,0xf8,compressionLevel,samplesBuffer,samplesSizes,nbSamples,
                        customDictContent,dictContentSize,params.notificationLevel);
    if (sVar11 < 0xffffffffffffff89) {
      __n = sVar11 + 8;
      __n_00 = dictBufferCapacity - __n;
      if (__n + dictContentSize <= dictBufferCapacity) {
        __n_00 = dictContentSize;
      }
      if (__n_00 < 8) {
        if (dictBufferCapacity < sVar11 + 0x10) {
          return 0xffffffffffffffba;
        }
        __n_01 = 8 - __n_00;
      }
      else {
        __n_01 = 0;
      }
      sVar11 = __n_00 + __n + __n_01;
      if (dictBufferCapacity < sVar11) {
        __assert_fail("dictSize <= dictBufferCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cc,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      __dest = (void *)((long)((long)dictBuffer + __n) + __n_01);
      if ((long)__dest + __n_00 != (long)dictBuffer + sVar11) {
        __assert_fail("outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cd,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      memmove(__dest,customDictContent,__n_00);
      memcpy(dictBuffer,header,__n);
      memset((void *)((long)dictBuffer + __n),0,__n_01);
    }
  }
  return sVar11;
}

Assistant:

size_t ZDICT_finalizeDictionary(void* dictBuffer, size_t dictBufferCapacity,
                          const void* customDictContent, size_t dictContentSize,
                          const void* samplesBuffer, const size_t* samplesSizes,
                          unsigned nbSamples, ZDICT_params_t params)
{
    size_t hSize;
#define HBUFFSIZE 256   /* should prove large enough for all entropy headers */
    BYTE header[HBUFFSIZE];
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    /* The final dictionary content must be at least as large as the largest repcode */
    size_t const minContentSize = (size_t)ZDICT_maxRep(repStartValue);
    size_t paddingSize;

    /* check conditions */
    DEBUGLOG(4, "ZDICT_finalizeDictionary");
    if (dictBufferCapacity < dictContentSize) return ERROR(dstSize_tooSmall);
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) return ERROR(dstSize_tooSmall);

    /* dictionary header */
    MEM_writeLE32(header, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64(customDictContent, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32(header+4, dictID);
    }
    hSize = 8;

    /* entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy(header+hSize, HBUFFSIZE-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  customDictContent, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* Shrink the content size if it doesn't fit in the buffer */
    if (hSize + dictContentSize > dictBufferCapacity) {
        dictContentSize = dictBufferCapacity - hSize;
    }

    /* Pad the dictionary content with zeros if it is too small */
    if (dictContentSize < minContentSize) {
        RETURN_ERROR_IF(hSize + minContentSize > dictBufferCapacity, dstSize_tooSmall,
                        "dictBufferCapacity too small to fit max repcode");
        paddingSize = minContentSize - dictContentSize;
    } else {
        paddingSize = 0;
    }

    {
        size_t const dictSize = hSize + paddingSize + dictContentSize;

        /* The dictionary consists of the header, optional padding, and the content.
         * The padding comes before the content because the "best" position in the
         * dictionary is the last byte.
         */
        BYTE* const outDictHeader = (BYTE*)dictBuffer;
        BYTE* const outDictPadding = outDictHeader + hSize;
        BYTE* const outDictContent = outDictPadding + paddingSize;

        assert(dictSize <= dictBufferCapacity);
        assert(outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize);

        /* First copy the customDictContent into its final location.
         * `customDictContent` and `dictBuffer` may overlap, so we must
         * do this before any other writes into the output buffer.
         * Then copy the header & padding into the output buffer.
         */
        memmove(outDictContent, customDictContent, dictContentSize);
        memcpy(outDictHeader, header, hSize);
        memset(outDictPadding, 0, paddingSize);

        return dictSize;
    }
}